

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O1

void __thiscall sf::Transformable::rotate(Transformable *this,float angle)

{
  float fVar1;
  double dVar2;
  
  dVar2 = fmod((double)(angle + this->m_rotation),360.0);
  fVar1 = (float)dVar2;
  this->m_rotation =
       (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 360.0) & -(uint)(fVar1 < 0.0));
  this->m_transformNeedUpdate = true;
  this->m_inverseTransformNeedUpdate = true;
  return;
}

Assistant:

void Transformable::rotate(float angle)
{
    setRotation(m_rotation + angle);
}